

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O3

void __thiscall
VulkanUtilities::VulkanCommandBuffer::CopyBufferToImage
          (VulkanCommandBuffer *this,VkBuffer srcBuffer,VkImage dstImage,
          VkImageLayout dstImageLayout,uint32_t regionCount,VkBufferImageCopy *pRegions)

{
  undefined4 in_register_0000000c;
  string msg;
  string local_50;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,dstImageLayout));
    Diligent::DebugAssertionFailed
              (local_50._M_dataplus._M_p,"CopyBufferToImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x21b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_State).RenderPass == (VkRenderPass)0x0) {
    if ((this->m_State).DynamicRenderingHash != 0) {
      EndRendering(this);
    }
  }
  else {
    EndRenderPass(this);
  }
  FlushBarriers(this);
  (*vkCmdCopyBufferToImage)
            (this->m_VkCmdBuffer,srcBuffer,dstImage,dstImageLayout,regionCount,pRegions);
  return;
}

Assistant:

__forceinline void CopyBufferToImage(VkBuffer                 srcBuffer,
                                         VkImage                  dstImage,
                                         VkImageLayout            dstImageLayout,
                                         uint32_t                 regionCount,
                                         const VkBufferImageCopy* pRegions)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Copy operations must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdCopyBufferToImage(m_VkCmdBuffer, srcBuffer, dstImage, dstImageLayout, regionCount, pRegions);
    }